

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
polyscope::render::backend_openGL_mock::GLAttributeBuffer::getDataRange_helper<int>
          (GLAttributeBuffer *this,size_t start,size_t count)

{
  bool bVar1;
  int iVar2;
  ulong in_RCX;
  ulong uVar3;
  long in_RDX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  int __fd;
  AttributeBuffer *in_RSI;
  AttributeBuffer *pAVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *readValues;
  allocator_type *in_stack_ffffffffffffff80;
  ulong in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *this_00;
  allocator local_41;
  string local_40 [16];
  string *in_stack_ffffffffffffffd0;
  
  uVar3 = in_RCX;
  pAVar4 = in_RSI;
  this_00 = in_RDI;
  bVar1 = AttributeBuffer::isSet(in_RSI);
  __fd = (int)pAVar4;
  if (bVar1) {
    in_stack_ffffffffffffff88 = in_RDX + in_RCX;
    in_stack_ffffffffffffff80 = (allocator_type *)AttributeBuffer::getDataSize(in_RSI);
    iVar2 = AttributeBuffer::getArrayCount(in_RSI);
    __addr = (sockaddr *)(long)iVar2;
    uVar3 = (long)in_stack_ffffffffffffff80 * (long)__addr;
    if (in_stack_ffffffffffffff88 <= uVar3) goto LAB_00524a30;
  }
  std::allocator<char>::allocator();
  __fd = 0x81241b;
  std::__cxx11::string::string(local_40,"bad getData",&local_41);
  exception(in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  __addr = extraout_RDX;
LAB_00524a30:
  bind((GLAttributeBuffer *)in_RSI,__fd,__addr,(socklen_t)uVar3);
  geometrycentral::surface::std::allocator<int>::allocator((allocator<int> *)0x524a57);
  std::vector<int,_std::allocator<int>_>::vector
            (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  geometrycentral::surface::std::allocator<int>::~allocator((allocator<int> *)0x524a76);
  return in_RDI;
}

Assistant:

std::vector<T> GLAttributeBuffer::getDataRange_helper(size_t start, size_t count) {
  if (!isSet() || start + count > static_cast<size_t>(getDataSize() * getArrayCount())) exception("bad getData");
  bind();
  std::vector<T> readValues(count);
  return readValues;
}